

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::jls_codec
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this,
          uint32_t *param_2,undefined8 *param_3)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar4 = param_2[0];
  uVar5 = param_2[1];
  uVar7 = *(ulong *)(param_2 + 2) & 0xffffffff | 0x100000000;
  if (*(int *)(param_3 + 1) != 0) {
    uVar7 = *(ulong *)(param_2 + 2);
  }
  (this->super_encoder_strategy)._vptr_encoder_strategy =
       (_func_int **)&PTR__encoder_strategy_0013b980;
  (this->super_encoder_strategy).frame_info_.width = uVar4;
  (this->super_encoder_strategy).frame_info_.height = uVar5;
  (this->super_encoder_strategy).frame_info_.bits_per_sample = (int)uVar7;
  (this->super_encoder_strategy).frame_info_.component_count = (int)(uVar7 >> 0x20);
  uVar2 = *param_3;
  uVar3 = param_3[1];
  (this->super_encoder_strategy).parameters_.near_lossless = (int)uVar2;
  (this->super_encoder_strategy).parameters_.restart_interval = (int)((ulong)uVar2 >> 0x20);
  (this->super_encoder_strategy).parameters_.interleave_mode = (int)uVar3;
  (this->super_encoder_strategy).parameters_.transformation = (int)((ulong)uVar3 >> 0x20);
  *(undefined4 *)&(this->super_encoder_strategy).parameters_.output_bgr =
       *(undefined4 *)(param_3 + 2);
  (this->super_encoder_strategy).decoder_._M_t.
  super___uniq_ptr_impl<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_>.
  _M_t.
  super__Tuple_impl<0UL,_charls::decoder_strategy_*,_std::default_delete<charls::decoder_strategy>_>
  .super__Head_base<0UL,_charls::decoder_strategy_*,_false>._M_head_impl = (decoder_strategy *)0x0;
  (this->super_encoder_strategy).process_line_._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl = (process_line *)0x0;
  (this->super_encoder_strategy).bit_buffer_ = 0;
  (this->super_encoder_strategy).free_bit_count_ = 0x20;
  (this->super_encoder_strategy).bytes_written_ = 0;
  (this->super_encoder_strategy).compressed_length_ = 0;
  (this->super_encoder_strategy).position_ = (uint8_t *)0x0;
  (this->super_encoder_strategy).is_ff_written_ = false;
  (this->super_encoder_strategy)._vptr_encoder_strategy = (_func_int **)&PTR__jls_codec_0013baa8;
  (this->rect_).X = 0;
  (this->rect_).Y = 0;
  (this->rect_).Width = 0;
  (this->rect_).Height = 0;
  this->width_ = *param_2;
  this->restart_interval_ = 0;
  this->restart_interval_counter_ = 0;
  this->t1_ = 0;
  this->t2_ = 0;
  *(undefined8 *)((long)&this->t2_ + 1) = 0;
  lVar6 = 0xa4;
  do {
    puVar1 = (undefined8 *)((long)this + lVar6 + -0xc);
    *puVar1 = 0;
    puVar1[1] = 0x100000000;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1774);
  lVar6 = 0;
  do {
    *(undefined8 *)((long)&(this->context_run_mode_)._M_elems[0].run_interruption_type_ + lVar6) = 0
    ;
    *(undefined2 *)(&(this->context_run_mode_)._M_elems[0].n_ + lVar6) = 1;
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x18);
  this->run_index_ = 0;
  this->previous_line_ = (pixel_type *)0x0;
  this->current_line_ = (pixel_type *)0x0;
  this->quantization_ = (int8_t *)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((*(int *)(param_3 + 1) == 0) &&
     ((this->super_encoder_strategy).frame_info_.component_count != 1)) {
    __assert_fail("(parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) || parameters.interleave_mode != interleave_mode::none"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                  ,0x6b,
                  "charls::jls_codec<charls::lossless_traits<uint8_t, 8>, charls::encoder_strategy>::jls_codec(Traits, const frame_info &, const coding_parameters &) [Traits = charls::lossless_traits<uint8_t, 8>, Strategy = charls::encoder_strategy]"
                 );
  }
  return;
}

Assistant:

jls_codec(Traits traits, const frame_info& frame_info, const coding_parameters& parameters) noexcept :
        Strategy{update_component_count(frame_info, parameters), parameters},
        traits_{std::move(traits)},
        width_{frame_info.width}
    {
        ASSERT((parameters.interleave_mode == interleave_mode::none && this->frame_info().component_count == 1) ||
               parameters.interleave_mode != interleave_mode::none);
        ASSERT(traits_.is_valid());
    }